

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.h
# Opt level: O3

complex<double> CRange::lngamma<double>(complex<double> *z)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar5;
  long lVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  double __y;
  double dVar8;
  double dVar9;
  complex<double> cVar10;
  
  dVar2 = *(double *)z->_M_value;
  __y = *(double *)(z->_M_value + 8);
  dVar3 = -dVar2;
  if (dVar2 <= dVar3) {
    __y = -__y;
  }
  dVar4 = (double)(-(ulong)(dVar3 < dVar2) & (ulong)(dVar2 + -1.0) |
                  ~-(ulong)(dVar3 < dVar2) & (ulong)dVar3);
  dVar2 = dVar4 + 5.5;
  dVar3 = SQRT(dVar2 * dVar2 + __y * __y);
  log(dVar3);
  atan2(__y,dVar2);
  log(dVar3);
  atan2(__y,dVar2);
  dVar3 = 1.000000000190015;
  dVar2 = 0.0;
  lVar6 = 0;
  do {
    pdVar1 = lngamma<double>::coeff + lVar6;
    lVar6 = lVar6 + 1;
    dVar9 = (double)(int)lVar6 + dVar4;
    dVar8 = *pdVar1 / (dVar9 * dVar9 + __y * __y);
    dVar2 = dVar2 + dVar8;
    dVar3 = dVar3 + dVar8 * dVar9;
  } while (lVar6 != 6);
  dVar2 = dVar2 * -__y;
  atan2(dVar2,dVar3);
  log(dVar2 * dVar2 + dVar3 * dVar3);
  uVar5 = extraout_RAX;
  uVar7 = extraout_RDX;
  if (*(double *)z->_M_value < 0.0) {
    dVar2 = csin(*(double *)z->_M_value * 3.141592653589793);
    clog(dVar2);
    uVar5 = extraout_RAX_00;
    uVar7 = extraout_RDX_00;
  }
  cVar10._M_value._8_8_ = uVar7;
  cVar10._M_value._0_8_ = uVar5;
  return (complex<double>)cVar10._M_value;
}

Assistant:

std::complex<T> lngamma( const std::complex<T> &z )
    {
        const static T coeff[6] = {76.18009172947146,
            -86.50532032941677,
            24.01409824083091,
            -1.231739572450155,
            0.1208650973866179e-2,
            -0.5395239384953e-5};
        T x, y;
        if(z.real() > 0) {
            x=z.real()-1.0;
            y=z.imag();
        } else {
            x=-z.real();
            y=-z.imag();
        }
        T r = sqrt((x+5.5)*(x+5.5)+y*y);
        T aterm1=y*log(r);
        T aterm2=(x+0.5)*atan2(y,(x+5.5))-y;
        T lterm1=(x+0.5)*log(r);
        T lterm2=-y*atan2(y,(x+5.5)) - (x+5.5) + 0.5*log(2.0*M_PI);
        T num=0.0;
        T denom=1.000000000190015;
        for(int j=1;j<7;j++){
            T fj=(T)j;
            T cterm=coeff[j-1]/((x+fj)*(x+fj)+y*y);
            num+=cterm;
            denom+=(x+fj)*cterm;
        }
        num*=-y;
        T aterm3=atan2(num,denom);
        T lterm3 = 0.5*log(num*num + denom*denom);
        std::complex<T> result(lterm1+lterm2+lterm3,aterm1+aterm2+aterm3);
        if(z.real() < 0){
            std::complex<T> lpi(log(M_PI), 0.0);
            result = lpi - (result + std::log(std::sin(M_PI*z)));
        }
        return(result);
    }